

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QMetaType __thiscall QMetaObject::metaType(QMetaObject *this)

{
  QByteArrayView typeName;
  QByteArrayView typeName_00;
  bool bVar1;
  QMetaObjectPrivate *pQVar2;
  char **in_RDI;
  long in_FS_OFFSET;
  QMetaTypeInterface *iface;
  qsizetype offset;
  QMetaObjectPrivate *d;
  QMetaObject *in_stack_ffffffffffffff88;
  int local_6c;
  QByteArrayView *in_stack_ffffffffffffffa0;
  QMetaTypeInterface *d_00;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = priv((uint *)in_RDI[2]);
  if (pQVar2->revision < 10) {
    className(in_stack_ffffffffffffff88);
    QByteArrayView::QByteArrayView<const_char_*,_true>(in_stack_ffffffffffffffa0,in_RDI);
    typeName.m_data = (storage_type *)in_stack_ffffffffffffffa0;
    typeName.m_size = (qsizetype)in_RDI;
    local_10 = QMetaType::fromName(typeName);
  }
  else {
    if (pQVar2->revision < 0xc) {
      local_6c = pQVar2->propertyCount;
    }
    else {
      local_6c = pQVar2->propertyCount + pQVar2->enumeratorCount;
    }
    d_00 = *(QMetaTypeInterface **)(in_RDI[5] + (long)local_6c * 8);
    if ((d_00 == (QMetaTypeInterface *)0x0) ||
       (bVar1 = QtMetaTypePrivate::isInterfaceFor<void>((QMetaTypeInterface *)0x35d735), !bVar1)) {
      if (d_00 == (QMetaTypeInterface *)0x0) {
        className(in_stack_ffffffffffffff88);
        QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)d_00,in_RDI);
        typeName_00.m_data = (storage_type *)d_00;
        typeName_00.m_size = (qsizetype)in_RDI;
        local_10 = QMetaType::fromName(typeName_00);
      }
      else {
        QMetaType::QMetaType(&local_10,d_00);
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QMetaType)local_10.d_ptr;
}

Assistant:

QMetaType QMetaObject::metaType() const
{

    const QMetaObjectPrivate *d = priv(this->d.data);
    if (d->revision < 10) {
        // before revision 10, we did not store the metatype in the metatype array
        return QMetaType::fromName(className());
    } else {
        /* in the metatype array, we store

         | index                               | data                           |
         |----------------------------------------------------------------------|
         | 0                                   | QMetaType(property0)           |
         | ...                                 | ...                            |
         | propertyCount - 1                   | QMetaType(propertyCount - 1)   |
         | propertyCount                       | QMetaType(enumerator0)         |
         | ...                                 | ...                            |
         | propertyCount + enumeratorCount - 1 | QMetaType(enumeratorCount - 1) |
         | propertyCount + enumeratorCount     | QMetaType(class)               |

        */
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
        // Before revision 12 we only stored metatypes for enums if they showed
        // up as types of properties or method arguments or return values.
        // From revision 12 on, we always store them in a predictable place.
        const qsizetype offset = d->revision < 12
                ? d->propertyCount
                : d->propertyCount + d->enumeratorCount;
#else
        const qsizetype offset = d->propertyCount + d->enumeratorCount;
#endif

        auto iface = this->d.metaTypes[offset];
        if (iface && QtMetaTypePrivate::isInterfaceFor<void>(iface))
            return QMetaType(); // return invalid meta-type for namespaces
        if (iface)
            return QMetaType(iface);
        else // in case of a dynamic metaobject, we might have no metatype stored
            return QMetaType::fromName(className()); // try lookup by name in that case
    }
}